

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory_posix.cpp
# Opt level: O1

bool __thiscall QSharedMemoryPosix::detach(QSharedMemoryPosix *this,QSharedMemoryPrivate *self)

{
  int iVar1;
  QSharedMemoryPrivate *__len;
  QLatin1StringView function;
  
  __len = (QSharedMemoryPrivate *)self->size;
  iVar1 = munmap(self->memory,(size_t)__len);
  if (iVar1 == -1) {
    function.m_data = "QSharedMemory::detach (munmap)";
    function.m_size = 0x1e;
    QSharedMemoryPrivate::setUnixErrorString(self,function);
  }
  else {
    self->memory = (void *)0x0;
    self->size = 0;
    cleanHandle(this,__len);
  }
  return iVar1 != -1;
}

Assistant:

bool QSharedMemoryPosix::detach(QSharedMemoryPrivate *self)
{
    // detach from the memory segment
    if (::munmap(self->memory, size_t(self->size)) == -1) {
        self->setUnixErrorString("QSharedMemory::detach (munmap)"_L1);
        return false;
    }
    self->memory = 0;
    self->size = 0;

#ifdef Q_OS_QNX
    // On QNX the st_nlink field of struct stat contains the number of
    // active shm_open() connections to the shared memory file, so we
    // can use it to automatically clean up the file once the last
    // user has detached from it.

    // get the number of current attachments
    int shm_nattch = 0;
    QT_STATBUF st;
    if (QT_FSTAT(hand, &st) == 0) {
        // subtract 2 from linkcount: one for our own open and one for the dir entry
        shm_nattch = st.st_nlink - 2;
    }

    cleanHandle(self);

    // if there are no attachments then unlink the shared memory
    if (shm_nattch == 0) {
        const QByteArray shmName = QFile::encodeName(self->nativeKey.nativeKey());
        if (::shm_unlink(shmName.constData()) == -1 && errno != ENOENT)
            self->setUnixErrorString("QSharedMemory::detach (shm_unlink)"_L1);
    }
#else
    // On non-QNX systems (tested Linux and Haiku), the st_nlink field is always 1,
    // so we'll simply leak the shared memory files.
    cleanHandle(self);
#endif

    return true;
}